

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  EnumValueDescriptor *descriptor_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *proto_00;
  int i;
  int index;
  
  DescriptorBuilder::ResolveFeatures<google::protobuf::EnumDescriptor>
            (*(DescriptorBuilder **)this,proto,descriptor,descriptor->options_,
             *(FlatAllocator **)(this + 8));
  for (index = 0; index < descriptor->value_count_; index = index + 1) {
    descriptor_00 = EnumDescriptor::value(descriptor,index);
    proto_00 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                         (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,index);
    DescriptorBuilder::ResolveFeatures<google::protobuf::EnumValueDescriptor>
              (*(DescriptorBuilder **)this,proto_00,descriptor_00,descriptor_00->options_,
               *(FlatAllocator **)(this + 8));
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }